

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_IDAT(ucvector *out,uchar *data,size_t datasize,LodePNGCompressSettings *zlibsettings)

{
  uint uVar1;
  uint error;
  ucvector zlibdata;
  LodePNGCompressSettings *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  uchar *in_stack_ffffffffffffffc8;
  size_t *in_stack_ffffffffffffffd0;
  ucvector *in_stack_ffffffffffffffd8;
  
  uVar2 = 0;
  ucvector_init((ucvector *)&stack0xffffffffffffffc8);
  uVar1 = zlib_compress(&in_stack_ffffffffffffffd8->data,in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffc8,CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
  if (uVar1 == 0) {
    uVar1 = addChunk(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffc8,(ulong)in_stack_ffffffffffffffc0);
  }
  ucvector_cleanup((void *)0x212060);
  return uVar1;
}

Assistant:

static unsigned addChunk_IDAT(ucvector* out, const unsigned char* data, size_t datasize,
                              LodePNGCompressSettings* zlibsettings)
{
  ucvector zlibdata;
  unsigned error = 0;

  /*compress with the Zlib compressor*/
  ucvector_init(&zlibdata);
  error = zlib_compress(&zlibdata.data, &zlibdata.size, data, datasize, zlibsettings);
  if(!error) error = addChunk(out, "IDAT", zlibdata.data, zlibdata.size);
  ucvector_cleanup(&zlibdata);

  return error;
}